

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emithelper.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseEmitHelper::emitArgsAssignment
          (BaseEmitHelper *this,FuncFrame *frame,FuncArgsAssignment *args)

{
  Arch AVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  bool bVar6;
  byte bVar7;
  uint32_t uVar8;
  uint32_t oldId;
  bool bVar9;
  Error EVar10;
  uint regId;
  RegMask RVar11;
  OperandSignature *pOVar12;
  WorkData *pWVar13;
  long lVar14;
  InstHints *pIVar15;
  FuncFrame *pFVar16;
  uint uVar17;
  int iVar18;
  FuncAttributes FVar19;
  long lVar20;
  byte *pbVar21;
  byte bVar22;
  FuncAttributes FVar23;
  ulong uVar24;
  Signature SVar25;
  undefined1 uVar26;
  OperandSignature OVar27;
  uint32_t *puVar28;
  Array<asmjit::v1_14::OperandSignature,_32UL> *pAVar29;
  uint uVar30;
  ulong uVar31;
  uint32_t newId;
  uint uVar32;
  ulong uVar33;
  RegGroup local_619;
  BaseReg dstReg;
  uint32_t local_5f0;
  uint local_5ec;
  long local_5e8;
  WorkData *local_5e0;
  Array<asmjit::v1_14::OperandSignature,_32UL> *local_5d8;
  ulong local_5d0;
  FuncFrame *local_5c8;
  RegGroup outGroup;
  undefined3 uStack_5bf;
  OperandSignature local_5bc;
  OperandSignature local_5b8;
  OperandSignature local_5b4;
  ulong local_5b0;
  ulong local_5a8;
  ulong local_5a0;
  Array<asmjit::v1_14::OperandSignature,_32UL> *local_598;
  uint32_t *local_590;
  OperandSignature local_584;
  uint32_t *local_580;
  FuncFrame *local_578;
  ulong local_570;
  RAConstraints constraints;
  FuncArgsContext ctx;
  
  AVar1 = frame->_arch;
  constraints._availableRegs._data[0] = 0;
  constraints._availableRegs._data[1] = 0;
  constraints._availableRegs._data[2] = 0;
  constraints._availableRegs._data[3] = 0;
  FuncArgsContext::FuncArgsContext(&ctx);
  EVar10 = RAConstraints::init(&constraints,(EVP_PKEY_CTX *)(ulong)AVar1);
  if ((EVar10 != 0) ||
     (local_5c8 = (FuncFrame *)this,
     EVar10 = FuncArgsContext::initWorkData(&ctx,frame,args,&constraints), EVar10 != 0)) {
    return EVar10;
  }
  lVar20 = (ulong)AVar1 * 0xd8;
  uVar24 = (ulong)ctx._varCount;
  local_570 = (ulong)ctx._saVarId;
  bVar22 = _archTraits[lVar20];
  regId = (uint)bVar22;
  local_5d8 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)CONCAT44(local_5d8._4_4_,(uint)bVar22)
  ;
  if (frame->_minDynamicAlignment <= frame->_finalStackAlignment) {
    if ((frame->_attributes & kHasPreservedFP) == kNoAttributes) {
      if (ctx._saVarId < ctx._varCount) {
        regId = (uint)*(byte *)((long)&ctx._vars[local_570].cur._data + 2);
      }
      else {
        regId = (uint)frame->_saRegId;
      }
    }
    else {
      regId = (uint)(byte)_archTraits[lVar20 + 1];
    }
  }
  uVar30 = *(uint *)(*(long *)&local_5c8->_spillZoneSize + 0x50);
  local_5b0 = (ulong)uVar30;
  local_5a8 = uVar24;
  local_578 = frame;
  if (ctx._stackDstMask != '\0') {
    uVar17 = (frame->_dirtyRegs)._data[(ulong)(regId != frame->_spRegId) - 3];
    local_5d0 = (ulong)uVar17;
    uVar30 = uVar30 & 0xf8;
    uVar31 = (ulong)uVar30;
    OVar27._bits = uVar30 + 2;
    puVar28 = (uint32_t *)CONCAT44(regId,uVar17);
    local_598 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)(_archTraits + lVar20 + 0x14);
    local_5e0 = (WorkData *)
                CONCAT44(local_5e0._4_4_,(uint)((AVar1 & k32BitMask) == kUnknown) * 4 + 4);
    local_580 = (uint32_t *)(_archTraits + lVar20 + 0x4c);
    pFVar16 = local_5c8;
    local_5a0 = uVar31;
    local_590 = puVar28;
    local_584._bits = OVar27._bits;
    for (uVar33 = 0; pAVar29 = local_598, iVar18 = (int)puVar28, uVar24 != uVar33;
        uVar33 = uVar33 + 1) {
      uVar30 = ctx._vars[uVar33].out._data;
      if ((uVar30 >> 9 & 1) != 0) {
        uVar17 = ctx._vars[uVar33].cur._data;
        if ((uVar17 & 0x300) == 0) {
LAB_0011cf76:
          emitArgsAssignment();
          if (iVar18 - 1U < 2) {
            RVar11 = 0xff;
            FVar19 = 0xffff;
            if ((char)iVar18 == '\x01') {
              FVar19 = 0xff;
            }
            FVar23 = FVar19 & ~kHasPreservedFP;
          }
          else {
            if (iVar18 != 6) {
              return 4;
            }
            RVar11 = 0;
            FVar19 = ~kNoAttributes;
            FVar23 = 0x7ffbffff;
          }
          frame->_attributes = FVar23;
          frame->_arch = (char)FVar19;
          frame->_spRegId = (char)(FVar19 >> 8);
          frame->_saRegId = (char)(FVar19 >> 0x10);
          frame->_redZoneSize = (char)(FVar19 >> 0x18);
          *(RegMask *)&frame->_spillZoneSize = RVar11;
          *(RegMask *)&frame->_localStackAlignment = RVar11;
          return 0;
        }
        dstReg.super_Operand.super_Operand_._signature._bits = 1;
        dstReg.super_Operand.super_Operand_._baseId = 0xff;
        dstReg.super_Operand.super_Operand_._data[0] = 0;
        dstReg.super_Operand.super_Operand_._data[1] = 0;
        local_5ec = (uint)local_5d8;
        if ((int)uVar31 == 0) {
          local_5ec = ((int)uVar30 >> 0x1f) + (uint)local_5d8;
        }
        local_5e8 = (ulong)(uint)((int)uVar30 >> 0xc) << 0x20;
        local_5b8._bits = 0;
        if ((int)uVar31 == 0) {
          uVar24 = (long)((int)uVar17 >> 0xc) + (long)local_590;
          local_5bc._bits = (uint32_t)(uVar24 >> 0x20);
        }
        else {
          uVar24 = (ulong)(((int)uVar17 >> 0xc) + (uint32_t)local_5d0);
          local_5bc._bits = regId;
        }
        local_5b4._bits = (uint32_t)uVar24;
        local_5f0 = OVar27._bits;
        _outGroup = OVar27._bits;
        if ((uVar17 >> 10 & 1) == 0) {
          if ((uVar17 >> 8 & 1) == 0) goto LAB_0011c7f1;
          local_619 = (RegGroup)(uVar17 >> 0x18);
          pOVar12 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                    operator[]<asmjit::v1_14::RegType>(local_598,&local_619);
          local_619 = *(RegGroup *)((long)&pOVar12->_bits + 1) & kMaxValue;
          pWVar13 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                    operator[]<asmjit::v1_14::RegGroup>(&ctx._workData,&local_619);
          OVar27._bits = local_584._bits;
          uVar31 = local_5a0;
          uVar30 = ctx._vars[uVar33].cur._data;
          uVar17 = uVar30 >> 0x10;
          local_619 = (RegGroup)(uVar30 >> 0x18);
          pOVar12 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                    operator[]<asmjit::v1_14::RegType>(pAVar29,&local_619);
          pFVar16 = local_5c8;
          dstReg.super_Operand.super_Operand_._0_8_ = CONCAT44(uVar17,pOVar12->_bits) & 0xffffffffff
          ;
          FuncArgsContext::WorkData::unassign(pWVar13,(uint32_t)uVar33,uVar17 & 0xff);
        }
        else {
          if ((uVar17 >> 9 & 1) != 0) {
            return 0x19;
          }
          local_5bc._bits = uVar17 >> 0x10 & 0xff;
LAB_0011c7f1:
          bVar22 = TypeUtils::_typeData[((ulong)uVar17 & 0xff) + 0x100];
          if ((byte)TypeUtils::_typeData[((ulong)uVar17 & 0xff) + 0x100] <
              (byte)TypeUtils::_typeData[((ulong)uVar30 & 0xff) + 0x100]) {
            bVar22 = TypeUtils::_typeData[((ulong)uVar30 & 0xff) + 0x100];
          }
          if ((uint)local_5e0 < bVar22) {
            if (((byte)((char)uVar30 - 0x20U) < 10) && ((byte)((char)uVar17 - 0x20U) < 10)) {
LAB_0011c853:
              lVar14 = 0x30;
              goto LAB_0011c856;
            }
            puVar28 = local_580;
            if (8 < bVar22) {
              if (bVar22 < 0x11) goto LAB_0011c951;
              if (bVar22 < 0x21) goto LAB_0011c968;
              if (0x40 < bVar22) {
                return 3;
              }
              goto LAB_0011c85b;
            }
            SVar25._bits = *(uint32_t *)(_archTraits + lVar20 + 0x40);
            if (SVar25._bits == 0) {
LAB_0011c951:
              SVar25._bits = *(uint32_t *)(_archTraits + lVar20 + 0x44);
              if (SVar25._bits == 0) {
LAB_0011c968:
                SVar25._bits = *(uint32_t *)(_archTraits + lVar20 + 0x48);
                if (SVar25._bits == 0) goto LAB_0011c85b;
              }
            }
          }
          else {
            lVar14 = 0x2c;
            if (4 < bVar22) goto LAB_0011c853;
LAB_0011c856:
            puVar28 = (uint32_t *)(_archTraits + lVar20 + lVar14);
LAB_0011c85b:
            SVar25._bits = *puVar28;
            if (SVar25._bits == 0) {
              return 3;
            }
          }
          local_619 = (RegGroup)(SVar25._bits >> 8) & kMaxValue;
          pWVar13 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                    operator[]<asmjit::v1_14::RegGroup>(&ctx._workData,&local_619);
          uVar30 = ~pWVar13->_assignedRegs & pWVar13->_workRegs;
          if (uVar30 == 0) {
            return 3;
          }
          dstReg.super_Operand.super_Operand_._baseId = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> dstReg.super_Operand.super_Operand_._baseId & 1) == 0;
                dstReg.super_Operand.super_Operand_._baseId =
                     dstReg.super_Operand.super_Operand_._baseId + 1) {
            }
          }
          dstReg.super_Operand.super_Operand_._signature._bits = SVar25._bits;
          EVar10 = (**(code **)(*(long *)pFVar16 + 0x20))
                             (pFVar16,&dstReg,(char)ctx._vars[uVar33].out._data,&outGroup,
                              (char)ctx._vars[uVar33].cur._data,0);
          if (EVar10 != 0) {
            return EVar10;
          }
        }
        uVar30 = ctx._vars[uVar33].cur._data;
        if ((~uVar30 & 0x500) == 0) {
          local_619 = k0;
          pWVar13 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                    operator[]<asmjit::v1_14::RegGroup>(&ctx._workData,&local_619);
          FuncArgsContext::WorkData::unassign
                    (pWVar13,(uint32_t)uVar33,
                     (uint)*(byte *)((long)&ctx._vars[uVar33].cur._data + 2));
          uVar30 = ctx._vars[uVar33].cur._data;
        }
        puVar28 = &local_5f0;
        frame = pFVar16;
        EVar10 = (**(code **)(*(long *)pFVar16 + 0x10))(pFVar16,puVar28,&dstReg,uVar30 & 0xff,0);
        if (EVar10 != 0) {
          return EVar10;
        }
        pbVar21 = (byte *)((long)&ctx._vars[uVar33].cur._data + 1);
        *pbVar21 = *pbVar21 | 8;
        uVar24 = local_5a8;
      }
    }
  }
  local_5d8 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)(_archTraits + lVar20 + 0x14);
  uVar31 = 0;
  uVar30 = 0;
  bVar6 = false;
  do {
    while (pAVar29 = local_5d8, uVar31 == uVar24) {
      if (!bVar6) {
        if (ctx._hasStackSrc != true) {
          return 0;
        }
        if ((local_578->_minDynamicAlignment <= local_578->_finalStackAlignment) &&
           ((local_578->_attributes & kHasPreservedFP) == kNoAttributes)) {
          if ((uint)local_570 < (uint)uVar24) {
            bVar22 = *(byte *)((long)&ctx._vars[local_570 & 0xffffffff].cur._data + 2);
          }
          else {
            bVar22 = local_578->_saRegId;
          }
          regId = (uint)bVar22;
        }
        uVar30 = (local_578->_dirtyRegs)._data[(ulong)(regId != local_578->_spRegId) - 3];
        local_5d0 = (ulong)uVar30;
        uVar17 = (uint)local_5b0 & 0xf8;
        local_5b0 = (ulong)uVar17;
        local_5e0 = (WorkData *)CONCAT44(local_5e0._4_4_,uVar17 + 2);
        local_590 = (uint32_t *)(ulong)regId;
        pAVar29 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)CONCAT44(regId,uVar30);
        uVar30 = 1;
        uVar17 = 0;
        frame = local_578;
        local_598 = pAVar29;
        do {
          if (uVar30 <= uVar17) {
            return 0;
          }
          local_5a0 = CONCAT44(local_5a0._4_4_,uVar17);
          for (uVar31 = 0; iVar18 = (int)pAVar29, uVar24 != uVar31; uVar31 = uVar31 + 1) {
            if ((ctx._vars[uVar31].cur._data & 0xa00) == 0x200) {
              uVar17 = ctx._vars[uVar31].out._data;
              if ((uVar17 >> 8 & 1) == 0) {
                emitArgsAssignment();
                goto LAB_0011cf76;
              }
              uVar32 = uVar17 >> 0x10 & 0xff;
              uVar26 = (undefined1)(uVar17 >> 0x18);
              dstReg.super_Operand.super_Operand_._signature._bits._0_1_ = uVar26;
              pOVar12 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                        operator[]<asmjit::v1_14::RegType>(local_5d8,(RegType *)&dstReg);
              _outGroup = CONCAT31(uStack_5bf,*(undefined1 *)((long)&pOVar12->_bits + 1)) &
                          0xffffff0f;
              frame = (FuncFrame *)&ctx._workData;
              pAVar29 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)&outGroup;
              pFVar16 = (FuncFrame *)
                        Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                        operator[]<asmjit::v1_14::RegGroup>
                                  ((Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL> *)frame,
                                   (RegGroup *)pAVar29);
              if ((uVar32 == regId) && (outGroup == k0)) {
                if (uVar30 == 1) {
                  uVar30 = 2;
                  uVar24 = local_5a8;
                  goto LAB_0011cf4b;
                }
                FuncArgsContext::WorkData::unassign
                          ((WorkData *)pFVar16,
                           (uint)*(uint8_t *)((long)&pFVar16->_daOffset + (long)local_590),regId);
              }
              local_5f0 = CONCAT31(local_5f0._1_3_,uVar26);
              pOVar12 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                        operator[]<asmjit::v1_14::RegType>(local_5d8,(RegType *)&local_5f0);
              dstReg.super_Operand.super_Operand_._0_8_ =
                   CONCAT44(uVar17 >> 0x10,pOVar12->_bits) & 0xffffffffff;
              dstReg.super_Operand.super_Operand_._data[0] = 0;
              dstReg.super_Operand.super_Operand_._data[1] = 0;
              uVar5 = ctx._vars[uVar31].cur._data;
              iVar18 = (int)uVar5 >> 0xc;
              local_5f0 = (uint)local_5e0;
              if (local_5b0._0_4_ == 0) {
                pbVar21 = (byte *)((long)&local_598->_data[0]._bits + (long)iVar18);
                local_5ec = (uint)((ulong)pbVar21 >> 0x20);
              }
              else {
                pbVar21 = (byte *)(ulong)(iVar18 + (uint32_t)local_5d0);
                local_5ec = regId;
              }
              local_5e8 = (long)pbVar21 << 0x20;
              EVar10 = (**(code **)(*(long *)local_5c8 + 0x20))
                                 (local_5c8,&dstReg,(char)ctx._vars[uVar31].out._data,&local_5f0,
                                  uVar5 & 0xff,0);
              if (EVar10 != 0) {
                return EVar10;
              }
              pAVar29 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)(uVar31 & 0xffffffff);
              FuncArgsContext::WorkData::assign((WorkData *)pFVar16,(uint32_t)uVar31,uVar32);
              ctx._vars[uVar31].cur._data =
                   (uint)(byte)ctx._vars[uVar31].cur._data + (uVar32 << 0x10 | uVar17 & 0xff000000)
                   + 0x900;
              uVar24 = local_5a8;
              frame = pFVar16;
            }
LAB_0011cf4b:
          }
          uVar17 = local_5a0._0_4_ + 1;
        } while( true );
      }
      if ((uVar30 & 5) == 4) {
        return 3;
      }
      uVar30 = (~uVar30 & 1) << 2;
      bVar6 = false;
      uVar31 = 0;
    }
    uVar17 = ctx._vars[uVar31].cur._data;
    if ((uVar17 & 0x900) == 0x100) {
      dstReg.super_Operand.super_Operand_._signature._bits._0_1_ = (char)(uVar17 >> 0x18);
      pOVar12 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                operator[]<asmjit::v1_14::RegType>(local_5d8,(RegType *)&dstReg);
      bVar22 = *(byte *)((long)&pOVar12->_bits + 1);
      dstReg.super_Operand.super_Operand_._signature._bits._0_1_ =
           *(undefined1 *)((long)&ctx._vars[uVar31].out._data + 3);
      pOVar12 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                operator[]<asmjit::v1_14::RegType>(pAVar29,(RegType *)&dstReg);
      bVar2 = *(byte *)((long)&pOVar12->_bits + 1);
      _outGroup = CONCAT31(uStack_5bf,bVar2) & 0xffffff0f;
      if ((bVar22 & 0xf) != (bVar2 & 0xf)) {
        return 0x19;
      }
      bVar2 = *(byte *)((long)&ctx._vars[uVar31].cur._data + 2);
      bVar3 = *(byte *)((long)&ctx._vars[uVar31].out._data + 2);
      newId = (uint32_t)bVar3;
      local_5e0 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                  operator[]<asmjit::v1_14::RegGroup>(&ctx._workData,&outGroup);
      bVar9 = FuncArgsContext::WorkData::isAssigned(local_5e0,(uint)bVar3);
      if (((uint)bVar2 == (uint)bVar3) || (!bVar9)) {
        local_5d0 = CONCAT44(local_5d0._4_4_,(uint)bVar2);
LAB_0011cb19:
        pAVar29 = local_5d8;
        dstReg.super_Operand.super_Operand_._signature._bits._0_1_ =
             *(undefined1 *)((long)&ctx._vars[uVar31].out._data + 3);
        pOVar12 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                  operator[]<asmjit::v1_14::RegType>(local_5d8,(RegType *)&dstReg);
        dstReg.super_Operand.super_Operand_._baseId = newId;
        dstReg.super_Operand.super_Operand_._signature._bits = pOVar12->_bits;
        dstReg.super_Operand.super_Operand_._data[0] = 0;
        dstReg.super_Operand.super_Operand_._data[1] = 0;
        uVar8 = ctx._vars[uVar31].out._data;
        local_5f0 = CONCAT31(local_5f0._1_3_,*(undefined1 *)((long)&ctx._vars[uVar31].cur._data + 3)
                            );
        pOVar12 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                  operator[]<asmjit::v1_14::RegType>(pAVar29,(RegType *)&local_5f0);
        local_5f0 = pOVar12->_bits;
        oldId = (uint32_t)local_5d0;
        local_5ec = (uint32_t)local_5d0;
        local_5e8 = 0;
        EVar10 = (**(code **)(*(long *)local_5c8 + 0x20))
                           (local_5c8,&dstReg,(char)uVar8,&local_5f0,
                            (char)ctx._vars[uVar31].cur._data,0);
        if (EVar10 != 0) {
          return EVar10;
        }
        if (oldId != newId) {
          FuncArgsContext::WorkData::reassign(local_5e0,(uint32_t)uVar31,newId,oldId);
        }
        uVar17 = ctx._vars[uVar31].out._data;
        ctx._vars[uVar31].cur._data =
             (uint)(newId == (uVar17 >> 0x10 & 0xff)) * 0x800 +
             (uVar17 & 0xff0000ff | newId << 0x10) + 0x100;
        uVar32 = 3;
        bVar7 = 1;
      }
      else {
        bVar4 = local_5e0->_physToVarId[bVar3];
        uVar17 = ctx._vars[bVar4].out._data;
        if (uVar17 == 0) {
LAB_0011cac5:
          dstReg.super_Operand.super_Operand_._0_8_ =
               CONCAT71(dstReg.super_Operand.super_Operand_._1_7_,bVar22) & 0xffffffffffffff0f;
          pIVar15 = Support::Array<asmjit::v1_14::InstHints,_4UL>::
                    operator[]<asmjit::v1_14::RegGroup>
                              ((Array<asmjit::v1_14::InstHints,_4UL> *)(_archTraits + lVar20 + 0x10)
                               ,(RegGroup *)&dstReg);
          if ((*pIVar15 & kRegSwap) == kNoHints) {
            uVar32 = 0;
            uVar17 = ~local_5e0->_assignedRegs & local_5e0->_workRegs;
            bVar7 = 1;
            if (uVar17 != 0) {
              local_5d0 = CONCAT44(local_5d0._4_4_,(uint)bVar2);
              uVar32 = ~local_5e0->_dstRegs & uVar17;
              if (uVar32 == 0) {
                uVar32 = uVar17;
              }
              newId = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> newId & 1) == 0; newId = newId + 1) {
                }
              }
              goto LAB_0011cb19;
            }
          }
          else {
            bVar22 = *(byte *)((long)&ctx._vars[bVar4].cur._data + 3);
            uVar32 = (uint)*(byte *)((long)&ctx._vars[uVar31].cur._data + 3);
            uVar17 = (uint)bVar22;
            if (bVar22 < uVar32) {
              uVar17 = uVar32;
            }
            if (uVar17 - 3 < 3) {
              uVar17 = 6;
            }
            dstReg.super_Operand.super_Operand_._signature._bits._0_1_ = (char)uVar17;
            pOVar12 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                      operator[]<asmjit::v1_14::RegType>(local_5d8,(RegType *)&dstReg);
            local_5f0 = pOVar12->_bits;
            dstReg.super_Operand.super_Operand_._baseId._0_1_ = bVar3;
            dstReg.super_Operand.super_Operand_._signature._bits = local_5f0;
            dstReg.super_Operand.super_Operand_._baseId._1_3_ = 0;
            dstReg.super_Operand.super_Operand_._data[0] = 0;
            dstReg.super_Operand.super_Operand_._data[1] = 0;
            local_5e8 = 0;
            local_5ec = (uint)bVar2;
            EVar10 = (**(code **)(*(long *)local_5c8 + 0x18))(local_5c8,&dstReg,&local_5f0,0);
            if (EVar10 != 0) {
              return EVar10;
            }
            FuncArgsContext::WorkData::swap
                      (local_5e0,(uint32_t)uVar31,(uint)bVar2,(uint)bVar4,(uint)bVar3);
            ctx._vars[uVar31].cur._data =
                 (ctx._vars[uVar31].cur._data & 0xff00f7ff) + (uint)bVar3 * 0x10000 + 0x800;
            uVar17 = ctx._vars[bVar4].cur._data & 0xff00ffff | (uint)bVar2 << 0x10;
            ctx._vars[bVar4].cur._data = uVar17;
            uVar32 = 1;
            bVar7 = 0;
            if (ctx._vars[bVar4].out._data != 0) {
              ctx._vars[bVar4].cur._data = uVar17 | 0x800;
              bVar7 = 0;
            }
          }
        }
        else {
          uVar32 = 0;
          bVar7 = 1;
          if (((uVar17 >> 8 & 1) != 0) && (bVar7 = 1, (uVar17 >> 0x10 & 0xff) == (uint)bVar2))
          goto LAB_0011cac5;
        }
      }
      uVar30 = uVar30 | uVar32;
      bVar6 = (bool)(bVar6 | bVar7);
      uVar24 = local_5a8;
    }
    uVar31 = uVar31 + 1;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseEmitHelper::emitArgsAssignment(const FuncFrame& frame, const FuncArgsAssignment& args) {
  typedef FuncArgsContext::Var Var;
  typedef FuncArgsContext::WorkData WorkData;

  enum WorkFlags : uint32_t {
    kWorkNone      = 0x00,
    kWorkDidSome   = 0x01,
    kWorkPending   = 0x02,
    kWorkPostponed = 0x04
  };

  Arch arch = frame.arch();
  const ArchTraits& archTraits = ArchTraits::byArch(arch);

  RAConstraints constraints;
  FuncArgsContext ctx;

  ASMJIT_PROPAGATE(constraints.init(arch));
  ASMJIT_PROPAGATE(ctx.initWorkData(frame, args, &constraints));

#ifdef ASMJIT_DUMP_ARGS_ASSIGNMENT
  {
    String sb;
    dumpAssignment(sb, ctx);
    printf("%s\n", sb.data());
  }
#endif

  auto& workData = ctx._workData;
  uint32_t varCount = ctx._varCount;
  uint32_t saVarId = ctx._saVarId;

  BaseReg sp = BaseReg(_emitter->_gpSignature, archTraits.spRegId());
  BaseReg sa = sp;

  if (frame.hasDynamicAlignment()) {
    if (frame.hasPreservedFP())
      sa.setId(archTraits.fpRegId());
    else
      sa.setId(saVarId < varCount ? ctx._vars[saVarId].cur.regId() : frame.saRegId());
  }

  // Register to stack and stack to stack moves must be first as now we have
  // the biggest chance of having as many as possible unassigned registers.

  if (ctx._stackDstMask) {
    // Base address of all arguments passed by stack.
    BaseMem baseArgPtr(sa, int32_t(frame.saOffset(sa.id())));
    BaseMem baseStackPtr(sp, 0);

    for (uint32_t varId = 0; varId < varCount; varId++) {
      Var& var = ctx._vars[varId];

      if (!var.out.isStack())
        continue;

      FuncValue& cur = var.cur;
      FuncValue& out = var.out;

      ASMJIT_ASSERT(cur.isReg() || cur.isStack());
      BaseReg reg;

      BaseMem dstStackPtr = baseStackPtr.cloneAdjusted(out.stackOffset());
      BaseMem srcStackPtr = baseArgPtr.cloneAdjusted(cur.stackOffset());

      if (cur.isIndirect()) {
        if (cur.isStack()) {
          // TODO: Indirect stack.
          return DebugUtils::errored(kErrorInvalidAssignment);
        }
        else {
          srcStackPtr.setBaseId(cur.regId());
        }
      }

      if (cur.isReg() && !cur.isIndirect()) {
        WorkData& wd = workData[archTraits.regTypeToGroup(cur.regType())];
        uint32_t regId = cur.regId();

        reg.setSignatureAndId(archTraits.regTypeToSignature(cur.regType()), regId);
        wd.unassign(varId, regId);
      }
      else {
        // Stack to reg move - tricky since we move stack to stack we can decide which register to use. In general
        // we follow the rule that IntToInt moves will use GP regs with possibility to signature or zero extend,
        // and all other moves will either use GP or VEC regs depending on the size of the move.
        OperandSignature signature = getSuitableRegForMemToMemMove(arch, out.typeId(), cur.typeId());
        if (ASMJIT_UNLIKELY(!signature.isValid()))
          return DebugUtils::errored(kErrorInvalidState);

        WorkData& wd = workData[signature.regGroup()];
        RegMask availableRegs = wd.availableRegs();
        if (ASMJIT_UNLIKELY(!availableRegs))
          return DebugUtils::errored(kErrorInvalidState);

        uint32_t availableId = Support::ctz(availableRegs);
        reg.setSignatureAndId(signature, availableId);

        ASMJIT_PROPAGATE(emitArgMove(reg, out.typeId(), srcStackPtr, cur.typeId()));
      }

      if (cur.isIndirect() && cur.isReg())
        workData[RegGroup::kGp].unassign(varId, cur.regId());

      // Register to stack move.
      ASMJIT_PROPAGATE(emitRegMove(dstStackPtr, reg, cur.typeId()));
      var.markDone();
    }
  }

  // Shuffle all registers that are currently assigned accordingly to target assignment.

  uint32_t workFlags = kWorkNone;
  for (;;) {
    for (uint32_t varId = 0; varId < varCount; varId++) {
      Var& var = ctx._vars[varId];
      if (var.isDone() || !var.cur.isReg())
        continue;

      FuncValue& cur = var.cur;
      FuncValue& out = var.out;

      RegGroup curGroup = archTraits.regTypeToGroup(cur.regType());
      RegGroup outGroup = archTraits.regTypeToGroup(out.regType());

      uint32_t curId = cur.regId();
      uint32_t outId = out.regId();

      if (curGroup != outGroup) {
        // TODO: Conversion is not supported.
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
      else {
        WorkData& wd = workData[outGroup];
        if (!wd.isAssigned(outId) || curId == outId) {
EmitMove:
          ASMJIT_PROPAGATE(
            emitArgMove(
              BaseReg(archTraits.regTypeToSignature(out.regType()), outId), out.typeId(),
              BaseReg(archTraits.regTypeToSignature(cur.regType()), curId), cur.typeId()));

          // Only reassign if this is not a sign/zero extension that happens on the same in/out register.
          if (curId != outId)
            wd.reassign(varId, outId, curId);

          cur.initReg(out.regType(), outId, out.typeId());

          if (outId == out.regId())
            var.markDone();
          workFlags |= kWorkDidSome | kWorkPending;
        }
        else {
          uint32_t altId = wd._physToVarId[outId];
          Var& altVar = ctx._vars[altId];

          if (!altVar.out.isInitialized() || (altVar.out.isReg() && altVar.out.regId() == curId)) {
            // Only few architectures provide swap operations, and only for few register groups.
            if (archTraits.hasInstRegSwap(curGroup)) {
              RegType highestType = Support::max(cur.regType(), altVar.cur.regType());
              if (Support::isBetween(highestType, RegType::kGp8Lo, RegType::kGp16))
                highestType = RegType::kGp32;

              OperandSignature signature = archTraits.regTypeToSignature(highestType);
              ASMJIT_PROPAGATE(
                emitRegSwap(BaseReg(signature, outId), BaseReg(signature, curId)));

              wd.swap(varId, curId, altId, outId);
              cur.setRegId(outId);
              var.markDone();
              altVar.cur.setRegId(curId);

              if (altVar.out.isInitialized())
                altVar.markDone();
              workFlags |= kWorkDidSome;
            }
            else {
              // If there is a scratch register it can be used to perform the swap.
              RegMask availableRegs = wd.availableRegs();
              if (availableRegs) {
                RegMask inOutRegs = wd.dstRegs();
                if (availableRegs & ~inOutRegs)
                  availableRegs &= ~inOutRegs;
                outId = Support::ctz(availableRegs);
                goto EmitMove;
              }
              else {
                workFlags |= kWorkPending;
              }
            }
          }
          else {
            workFlags |= kWorkPending;
          }
        }
      }
    }

    if (!(workFlags & kWorkPending))
      break;

    // If we did nothing twice it means that something is really broken.
    if ((workFlags & (kWorkDidSome | kWorkPostponed)) == kWorkPostponed)
      return DebugUtils::errored(kErrorInvalidState);

    workFlags = (workFlags & kWorkDidSome) ? kWorkNone : kWorkPostponed;
  }

  // Load arguments passed by stack into registers. This is pretty simple and
  // it never requires multiple iterations like the previous phase.

  if (ctx._hasStackSrc) {
    uint32_t iterCount = 1;
    if (frame.hasDynamicAlignment() && !frame.hasPreservedFP())
      sa.setId(saVarId < varCount ? ctx._vars[saVarId].cur.regId() : frame.saRegId());

    // Base address of all arguments passed by stack.
    BaseMem baseArgPtr(sa, int32_t(frame.saOffset(sa.id())));

    for (uint32_t iter = 0; iter < iterCount; iter++) {
      for (uint32_t varId = 0; varId < varCount; varId++) {
        Var& var = ctx._vars[varId];
        if (var.isDone())
          continue;

        if (var.cur.isStack()) {
          ASMJIT_ASSERT(var.out.isReg());

          uint32_t outId = var.out.regId();
          RegType outType = var.out.regType();

          RegGroup group = archTraits.regTypeToGroup(outType);
          WorkData& wd = workData[group];

          if (outId == sa.id() && group == RegGroup::kGp) {
            // This register will be processed last as we still need `saRegId`.
            if (iterCount == 1) {
              iterCount++;
              continue;
            }
            wd.unassign(wd._physToVarId[outId], outId);
          }

          BaseReg dstReg = BaseReg(archTraits.regTypeToSignature(outType), outId);
          BaseMem srcMem = baseArgPtr.cloneAdjusted(var.cur.stackOffset());

          ASMJIT_PROPAGATE(emitArgMove(
            dstReg, var.out.typeId(),
            srcMem, var.cur.typeId()));

          wd.assign(varId, outId);
          var.cur.initReg(outType, outId, var.cur.typeId(), FuncValue::kFlagIsDone);
        }
      }
    }
  }

  return kErrorOk;
}